

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O0

double __thiscall Confparse::ParseDouble(Confparse *this,char *key,double defaultv)

{
  char *__nptr;
  int *piVar1;
  double in_XMM0_Qa;
  char *unaff_retaddr;
  double v;
  char *p;
  double local_8;
  
  __nptr = Parse((Confparse *)v,unaff_retaddr);
  local_8 = in_XMM0_Qa;
  if (__nptr != (char *)0x0) {
    local_8 = strtod(__nptr,(char **)0x0);
    piVar1 = __errno_location();
    if (*piVar1 == 0x22) {
      local_8 = in_XMM0_Qa;
    }
  }
  return local_8;
}

Assistant:

double Confparse::ParseDouble(const char *key, double defaultv) {
	char *p = Parse(key);
	if (p) {
		double v = strtod(p, NULL);
		if (errno == ERANGE)
			return defaultv;
		else
			return v;

	} else
		return defaultv;
}